

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O1

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::MCol>
          (Structure *this,MCol *dest,FileDatabase *db)

{
  ReadField<2,char>(this,&dest->r,"r",db);
  ReadField<2,char>(this,&dest->g,"g",db);
  ReadField<2,char>(this,&dest->b,"b",db);
  ReadField<2,char>(this,&dest->a,"a",db);
  StreamReader<true,_true>::IncPtr
            ((db->reader).
             super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,this->size);
  return;
}

Assistant:

void Structure :: Convert<MCol> (
    MCol& dest,
    const FileDatabase& db
    ) const
{

    ReadField<ErrorPolicy_Fail>(dest.r,"r",db);
    ReadField<ErrorPolicy_Fail>(dest.g,"g",db);
    ReadField<ErrorPolicy_Fail>(dest.b,"b",db);
    ReadField<ErrorPolicy_Fail>(dest.a,"a",db);

    db.reader->IncPtr(size);
}